

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XGLLoader.cpp
# Opt level: O1

aiLight * __thiscall Assimp::XGLImporter::ReadDirectionalLight(XGLImporter *this)

{
  bool bVar1;
  int iVar2;
  aiLight *paVar3;
  aiVector3D aVar4;
  ai_real local_5c;
  ai_real local_58;
  ai_real local_54;
  string local_50;
  
  paVar3 = (aiLight *)operator_new(0x46c);
  (paVar3->mName).length = 0;
  (paVar3->mName).data[0] = '\0';
  memset((paVar3->mName).data + 1,0x1b,0x3ff);
  paVar3->mType = aiLightSource_UNDEFINED;
  (paVar3->mPosition).x = 0.0;
  (paVar3->mPosition).y = 0.0;
  (paVar3->mPosition).z = 0.0;
  (paVar3->mDirection).x = 0.0;
  (paVar3->mDirection).y = 0.0;
  *(undefined8 *)&(paVar3->mDirection).z = 0;
  (paVar3->mUp).x = 0.0;
  (paVar3->mUp).y = 0.0;
  *(undefined8 *)&(paVar3->mUp).z = 0;
  paVar3->mAttenuationLinear = 1.0;
  paVar3->mAttenuationQuadratic = 0.0;
  (paVar3->mColorDiffuse).r = 0.0;
  (paVar3->mColorDiffuse).g = 0.0;
  (paVar3->mColorDiffuse).b = 0.0;
  (paVar3->mColorSpecular).r = 0.0;
  (paVar3->mColorSpecular).g = 0.0;
  *(undefined8 *)&(paVar3->mColorSpecular).b = 0;
  (paVar3->mColorAmbient).g = 0.0;
  (paVar3->mColorAmbient).b = 0.0;
  paVar3->mAngleInnerCone = 6.2831855;
  paVar3->mAngleOuterCone = 6.2831855;
  (paVar3->mSize).x = 0.0;
  (paVar3->mSize).y = 0.0;
  paVar3->mType = aiLightSource_DIRECTIONAL;
  while( true ) {
    bVar1 = ReadElementUpToClosing(this,"directionallight");
    if (!bVar1) break;
    GetElementName_abi_cxx11_(&local_50,this);
    iVar2 = std::__cxx11::string::compare((char *)&local_50);
    if (iVar2 == 0) {
      aVar4 = ReadVec3(this);
      (paVar3->mDirection).x = (float)(int)aVar4._0_8_;
      (paVar3->mDirection).y = (float)(int)((ulong)aVar4._0_8_ >> 0x20);
      (paVar3->mDirection).z = aVar4.z;
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)&local_50);
      if (iVar2 == 0) {
        ReadCol3((XGLImporter *)&local_5c);
        (paVar3->mColorDiffuse).r = local_5c;
        (paVar3->mColorDiffuse).g = local_58;
        (paVar3->mColorDiffuse).b = local_54;
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)&local_50);
        if (iVar2 == 0) {
          ReadCol3((XGLImporter *)&local_5c);
          (paVar3->mColorSpecular).r = local_5c;
          (paVar3->mColorSpecular).g = local_58;
          (paVar3->mColorSpecular).b = local_54;
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return paVar3;
}

Assistant:

aiLight* XGLImporter::ReadDirectionalLight()
{
    std::unique_ptr<aiLight> l(new aiLight());
    l->mType = aiLightSource_DIRECTIONAL;

    while (ReadElementUpToClosing("directionallight"))  {
        const std::string& s = GetElementName();
        if (s == "direction") {
            l->mDirection = ReadVec3();
        }
        else if (s == "diffuse") {
            l->mColorDiffuse = ReadCol3();
        }
        else if (s == "specular") {
            l->mColorSpecular = ReadCol3();
        }
    }
    return l.release();
}